

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::TypeParameterizedTestSuiteRegistry::CheckForInstantiations
          (TypeParameterizedTestSuiteRegistry *this)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  *__k;
  _Rb_tree_color _Var1;
  char *__s;
  const_iterator cVar2;
  long *plVar3;
  TestFactoryBase *factory;
  _Base_ptr p_Var4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  _Rb_tree_node_base *p_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  _func_int **local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  local_1b8;
  _Base_ptr local_168;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_160;
  _Rb_tree_node_base *local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
  local_130;
  size_type local_e0;
  size_type *local_d8;
  string full_name;
  string message;
  size_type local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  long lStack_80;
  CodeLocation local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  UnitTest::GetInstance();
  p_Var4 = (this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(this->suites_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var4 != p_Var8) {
    local_160 = &(UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_;
    local_168 = &((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t.
                 _M_impl.super__Rb_tree_header._M_header;
    local_158 = p_Var8;
    do {
      paVar7 = &local_150.field_2;
      if (*(char *)&p_Var4[3]._M_parent == '\0') {
        __k = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
               *)(p_Var4 + 1);
        cVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_160->_M_t,(key_type *)__k);
        if (cVar2._M_node == local_168) {
          std::operator+(&local_50,"Type parameterized test suite ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_78.file._M_dataplus._M_p = (pointer)&local_78.file.field_2;
          psVar5 = (size_type *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_78.file.field_2._M_allocated_capacity = *psVar5;
            local_78.file.field_2._8_8_ = plVar3[3];
          }
          else {
            local_78.file.field_2._M_allocated_capacity = *psVar5;
            local_78.file._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_78.file._M_string_length = plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_78,*(ulong *)(p_Var4 + 1))
          ;
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar3 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar3 == paVar6) {
            local_150.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_150.field_2._8_8_ = plVar3[3];
            local_150._M_dataplus._M_p = (pointer)paVar7;
          }
          else {
            local_150.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
            local_150._M_dataplus._M_p = (pointer)*plVar3;
          }
          local_150._M_string_length = plVar3[1];
          *plVar3 = (long)paVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_150);
          full_name.field_2._8_8_ = &message._M_string_length;
          psVar5 = (size_type *)(plVar3 + 2);
          if ((size_type *)*plVar3 == psVar5) {
            message._M_string_length = *psVar5;
            message.field_2._M_allocated_capacity = plVar3[3];
          }
          else {
            message._M_string_length = *psVar5;
            full_name.field_2._8_8_ = (size_type *)*plVar3;
          }
          message._M_dataplus._M_p = (pointer)plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar7) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.file._M_dataplus._M_p != &local_78.file.field_2) {
            operator_delete(local_78.file._M_dataplus._M_p,
                            local_78.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_150,"UninstantiatedTypeParameterizedTestSuite<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
          plVar3 = (long *)std::__cxx11::string::append((char *)&local_150);
          local_d8 = &full_name._M_string_length;
          psVar5 = (size_type *)(plVar3 + 2);
          if ((size_type *)*plVar3 == psVar5) {
            full_name._M_string_length = *psVar5;
            full_name.field_2._M_allocated_capacity = plVar3[3];
          }
          else {
            full_name._M_string_length = *psVar5;
            local_d8 = (size_type *)*plVar3;
          }
          full_name._M_dataplus._M_p = (pointer)plVar3[1];
          *plVar3 = (long)psVar5;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar7) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          psVar5 = local_d8;
          __s = *(char **)(p_Var4 + 2);
          _Var1 = p_Var4[3]._M_color;
          local_1d8 = &local_1c8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d8,full_name.field_2._8_8_,
                     message._M_dataplus._M_p + full_name.field_2._8_8_);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair(&local_1b8,__k);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          local_e0 = 0x16;
          local_50._M_dataplus._M_p =
               (pointer)std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_e0);
          local_50.field_2._M_allocated_capacity = local_e0;
          builtin_strncpy(local_50._M_dataplus._M_p,"GoogleTestVerification",0x16);
          local_50._M_string_length = local_e0;
          local_50._M_dataplus._M_p[local_e0] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(message.field_2._M_local_buf + 8),__s,(allocator<char> *)&local_e0);
          local_78.file._M_dataplus._M_p = (pointer)&local_78.file.field_2;
          if ((undefined1 *)message.field_2._8_8_ == &local_88) {
            local_78.file.field_2._8_8_ = lStack_80;
          }
          else {
            local_78.file._M_dataplus._M_p = (pointer)message.field_2._8_8_;
          }
          local_78.file.field_2._M_allocated_capacity._1_7_ = uStack_87;
          local_78.file.field_2._M_local_buf[0] = local_88;
          local_78.file._M_string_length = local_90;
          local_90 = 0;
          local_88 = 0;
          message.field_2._8_8_ = &local_88;
          local_78.line = _Var1;
          factory = (TestFactoryBase *)operator_new(0x78);
          paVar7 = &local_150.field_2;
          if (local_1d8 == &local_1c8) {
            local_150.field_2._8_8_ = local_1c8._8_8_;
            local_150._M_dataplus._M_p = (pointer)paVar7;
          }
          else {
            local_150._M_dataplus._M_p = (pointer)local_1d8;
          }
          local_150.field_2._M_allocated_capacity._1_7_ = local_1c8._M_allocated_capacity._1_7_;
          local_150.field_2._M_local_buf[0] = local_1c8._M_local_buf[0];
          local_150._M_string_length = (size_type)local_1d0;
          local_1d0 = (_func_int **)0x0;
          local_1c8._M_local_buf[0] = '\0';
          local_1d8 = &local_1c8;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair(&local_130,&local_1b8);
          factory->_vptr_TestFactoryBase =
               (_func_int **)
               (
               _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal34TypeParameterizedTestSuiteRegistry22CheckForInstantiationsEvE3__0EEPNS_8TestInfoEPKcS8_S8_S8_S8_iT0_E11FactoryImpl
               + 0x10);
          factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p == paVar7) {
            factory[3]._vptr_TestFactoryBase = (_func_int **)local_150.field_2._M_allocated_capacity
            ;
            factory[4]._vptr_TestFactoryBase = (_func_int **)local_150.field_2._8_8_;
          }
          else {
            factory[1]._vptr_TestFactoryBase = (_func_int **)local_150._M_dataplus._M_p;
            factory[3]._vptr_TestFactoryBase = (_func_int **)local_150.field_2._M_allocated_capacity
            ;
          }
          factory[2]._vptr_TestFactoryBase = (_func_int **)local_150._M_string_length;
          local_150._M_string_length = 0;
          local_150.field_2._M_allocated_capacity =
               local_150.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_150._M_dataplus._M_p = (pointer)paVar7;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::TypeParameterizedTestSuiteRegistry::TypeParameterizedTestSuiteInfo>
                  *)(factory + 5),&local_130);
          MakeAndRegisterTestInfo
                    (&local_50,(char *)psVar5,(char *)0x0,(char *)0x0,&local_78,
                     &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
                     (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
          p_Var8 = local_158;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130.second.code_location.file._M_dataplus._M_p !=
              &local_130.second.code_location.file.field_2) {
            operator_delete(local_130.second.code_location.file._M_dataplus._M_p,
                            local_130.second.code_location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130.first._M_dataplus._M_p != &local_130.first.field_2) {
            operator_delete(local_130.first._M_dataplus._M_p,
                            local_130.first.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != paVar7) {
            operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.file._M_dataplus._M_p != &local_78.file.field_2) {
            operator_delete(local_78.file._M_dataplus._M_p,
                            local_78.file.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)message.field_2._8_8_ != &local_88) {
            operator_delete((void *)message.field_2._8_8_,CONCAT71(uStack_87,local_88) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.second.code_location.file._M_dataplus._M_p !=
              &local_1b8.second.code_location.file.field_2) {
            operator_delete(local_1b8.second.code_location.file._M_dataplus._M_p,
                            local_1b8.second.code_location.file.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8.first._M_dataplus._M_p != &local_1b8.first.field_2) {
            operator_delete(local_1b8.first._M_dataplus._M_p,
                            local_1b8.first.field_2._M_allocated_capacity + 1);
          }
          if (local_1d8 != &local_1c8) {
            operator_delete(local_1d8,
                            CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]
                                    ) + 1);
          }
          if (local_d8 != &full_name._M_string_length) {
            operator_delete(local_d8,full_name._M_string_length + 1);
          }
          if ((size_type *)full_name.field_2._8_8_ != &message._M_string_length) {
            operator_delete((void *)full_name.field_2._8_8_,message._M_string_length + 1);
          }
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != p_Var8);
  }
  return;
}

Assistant:

void TypeParameterizedTestSuiteRegistry::CheckForInstantiations() {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  for (const auto& testcase : suites_) {
    if (testcase.second.instantiated) continue;
    if (ignored.find(testcase.first) != ignored.end()) continue;

    std::string message =
        "Type parameterized test suite " + testcase.first +
        " is defined via REGISTER_TYPED_TEST_SUITE_P, but never instantiated "
        "via INSTANTIATE_TYPED_TEST_SUITE_P. None of the test cases will run."
        "\n\n"
        "Ideally, TYPED_TEST_P definitions should only ever be included as "
        "part of binaries that intend to use them. (As opposed to, for "
        "example, being placed in a library that may be linked in to get "
        "other "
        "utilities.)"
        "\n\n"
        "To suppress this error for this test suite, insert the following "
        "line "
        "(in a non-header) in the namespace it is defined in:"
        "\n\n"
        "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
        testcase.first + ");";

    std::string full_name =
        "UninstantiatedTypeParameterizedTestSuite<" + testcase.first + ">";
    RegisterTest(  //
        "GoogleTestVerification", full_name.c_str(),
        nullptr,  // No type parameter.
        nullptr,  // No value parameter.
        testcase.second.code_location.file.c_str(),
        testcase.second.code_location.line, [message, testcase] {
          return new FailureTest(testcase.second.code_location, message,
                                 kErrorOnUninstantiatedTypeParameterizedTest);
        });
  }
}